

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O0

void __thiscall
PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
          (ImageTemplate<unsigned_char> *this,uint32_t width_,uint32_t height_,uint8_t colorCount_,
          uint8_t alignment_)

{
  undefined1 in_CL;
  undefined4 in_EDX;
  undefined4 in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  undefined1 in_R8B;
  ImageTemplate<unsigned_char> *unaff_retaddr;
  undefined7 in_stack_ffffffffffffffd8;
  uint8_t in_stack_ffffffffffffffdf;
  uint32_t in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffec;
  
  in_RDI->_vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00217bc8;
  in_RDI->_width = 0;
  in_RDI->_height = 0;
  in_RDI->_colorCount = '\x01';
  in_RDI->_alignment = '\x01';
  in_RDI->_rowSize = 0;
  in_RDI->_data = (uchar *)0x0;
  in_RDI->_type = '\0';
  _setType(unaff_retaddr,(uint8_t)((ulong)in_RDI >> 0x38),(AllocateFunction)CONCAT44(in_ESI,in_EDX),
           (DeallocateFunction)
           CONCAT17(in_CL,CONCAT16(in_R8B,CONCAT24(in_stack_ffffffffffffffec,
                                                   in_stack_ffffffffffffffe8))),(CopyFunction)in_RDI
           ,(SetFunction)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  setColorCount(in_RDI,in_stack_ffffffffffffffdf);
  setAlignment(in_RDI,in_stack_ffffffffffffffdf);
  resize((ImageTemplate<unsigned_char> *)CONCAT44(in_ESI,in_EDX),
         CONCAT13(in_CL,CONCAT12(in_R8B,in_stack_ffffffffffffffec)),in_stack_ffffffffffffffe8);
  return;
}

Assistant:

ImageTemplate( uint32_t width_ = 0u, uint32_t height_ = 0u, uint8_t colorCount_ = 1u, uint8_t alignment_ = 1u )
            : _width     ( 0 )       // width of image
            , _height    ( 0 )       // height of image
            , _colorCount( 1 )       // number of colors per pixel
            , _alignment ( 1 )       // some formats require that row size must be a multiple of some value (alignment)
                                     // for example for Bitmap it must be a multiple of 4
            , _rowSize   ( 0 )       // size of single row on image, usually it is equal to width
            , _data      ( nullptr ) // an array what store image information (pixel data)
            , _type      ( 0 )       // special attribute to specify different types of images based on technology it is used for
        {
            _setType();

            setColorCount( colorCount_ );
            setAlignment( alignment_ );
            resize( width_, height_ );
        }